

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QHeaderViewPrivate::LayoutChangeItem>::clear
          (QList<QHeaderViewPrivate::LayoutChangeItem> *this)

{
  Data *pDVar1;
  LayoutChangeItem *pLVar2;
  longlong lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem> local_40;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->d).size;
  if (lVar4 != 0) {
    pDVar1 = (this->d).d;
    if (pDVar1 == (Data *)0x0) {
      lVar3 = 0;
    }
    else {
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
        pLVar2 = (this->d).ptr;
        lVar4 = lVar4 << 4;
        do {
          QPersistentModelIndex::~QPersistentModelIndex(&pLVar2->index);
          pLVar2 = pLVar2 + 1;
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != 0);
        (this->d).size = 0;
        goto LAB_0055260a;
      }
      lVar3 = (pDVar1->super_QArrayData).alloc;
    }
    local_40.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_40.ptr = (LayoutChangeItem *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pLVar2 = (LayoutChangeItem *)QArrayData::allocate(&local_28,0x10,0x10,lVar3,KeepSize);
    local_40.d = (this->d).d;
    (this->d).d = (Data *)local_28;
    local_40.ptr = (this->d).ptr;
    (this->d).ptr = pLVar2;
    local_40.size = (this->d).size;
    (this->d).size = 0;
    QArrayDataPointer<QHeaderViewPrivate::LayoutChangeItem>::~QArrayDataPointer(&local_40);
  }
LAB_0055260a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }